

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O2

void __thiscall
duckdb::WriteAheadLog::WriteCreateTableMacro(WriteAheadLog *this,TableMacroCatalogEntry *entry)

{
  TableMacroCatalogEntry *local_5c0;
  WriteAheadLogSerializer serializer;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&serializer,this,CREATE_TABLE_MACRO);
  local_5c0 = entry;
  Serializer::WriteProperty<duckdb::TableMacroCatalogEntry_const*>
            (&serializer.serializer.super_Serializer,0x65,"table",&local_5c0);
  WriteAheadLogSerializer::End(&serializer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&serializer);
  return;
}

Assistant:

void WriteAheadLog::WriteCreateTableMacro(const TableMacroCatalogEntry &entry) {
	WriteAheadLogSerializer serializer(*this, WALType::CREATE_TABLE_MACRO);
	serializer.WriteProperty(101, "table", &entry);
	serializer.End();
}